

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BifFileReader.cpp
# Opt level: O1

void __thiscall BifFileReader<NWN::ResRef16>::~BifFileReader(BifFileReader<NWN::ResRef16> *this)

{
  pointer p_Var1;
  pointer pcVar2;
  uchar *__addr;
  
  (this->super_IResourceAccessor<NWN::ResRef16>)._vptr_IResourceAccessor =
       (_func_int **)&PTR_OpenFile_00194098;
  if ((FILE *)this->m_File != (FILE *)0x0) {
    fclose((FILE *)this->m_File);
    this->m_File = (HANDLE)0x0;
  }
  p_Var1 = (this->m_ResDir).
           super__Vector_base<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE,_std::allocator<BifFileReader<NWN::ResRef16>::_BIF_RESOURCE>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (p_Var1 != (pointer)0x0) {
    operator_delete(p_Var1);
  }
  pcVar2 = (this->m_BifFileName)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar2 != &(this->m_BifFileName).field_2) {
    operator_delete(pcVar2);
  }
  __addr = (this->m_FileWrapper).m_View;
  if (__addr != (uchar *)0x0) {
    if ((this->m_FileWrapper).m_ExternalView == false) {
      munmap(__addr,(this->m_FileWrapper).m_Size);
    }
    (this->m_FileWrapper).m_View = (uchar *)0x0;
  }
  return;
}

Assistant:

BifFileReader< ResRefT >::~BifFileReader(
	)
/*++

Routine Description:

	This routine cleans up an already-existing BifFileReader object.

Arguments:

	None.

Return Value:

	None.

Environment:

	User mode.

--*/
{
	if (m_File != nullptr)
	{

#if defined(_WINDOWS)
		CloseHandle( m_File );
#else
		fclose(m_File);
#endif
		m_File = nullptr;
	}
}